

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  Simplex_handle sh_00;
  bool bVar1;
  uint dim_sigma;
  Filtration_simplex_range *this_00;
  reference puVar2;
  Simplex_key x;
  reference puVar3;
  reference pvVar4;
  reference ppVar5;
  reference ppVar6;
  bool local_171;
  Simplex_handle local_148;
  Simplex_handle local_140;
  Simplex_key SStack_138;
  pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
  cocycle;
  _Self local_118;
  iterator __end0_3;
  iterator __begin0_3;
  map<unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  *__range3_3;
  Simplex_handle local_f8;
  Simplex_handle local_f0;
  unsigned_long uStack_e8;
  pair<const_unsigned_long,_unsigned_long> zero_idx;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_d0;
  iterator __end0_2;
  iterator __begin0_2;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range3_2;
  Simplex_handle local_b0;
  Simplex_handle local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_98;
  size_type local_90;
  Simplex_key key;
  iterator __end0_1;
  iterator __begin0_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3_1;
  int dim_simplex;
  unsigned_long sh;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertices;
  Simplex_key idx_fil;
  Filtration_value min_interval_length_local;
  Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  if (0 < this->dim_max_) {
    length_interval::set_length(&this->interval_length_policy,min_interval_length);
    vertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    this_00 = cubical_complex::
              Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
              filtration_simplex_range(this->cpx_);
    __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    sh = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&sh), bVar1) {
      puVar2 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0);
      sh_00 = *puVar2;
      vertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)vertices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 1);
      cubical_complex::
      Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
      assign_key(this->cpx_,sh_00,
                 (Simplex_key)
                 vertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      x = cubical_complex::
          Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::key
                    (this->cpx_,sh_00);
      boost::disjoint_sets<int_*,_unsigned_long_*,_boost::find_with_full_path_compression>::
      make_set<unsigned_long>(&this->dsets_,x);
      dim_sigma = cubical_complex::
                  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                  ::dimension(this->cpx_,sh_00);
      if (dim_sigma == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3,
                   (value_type_conflict2 *)
                   &vertices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else if (dim_sigma == 1) {
        update_cohomology_groups_edge(this,sh_00);
      }
      else {
        update_cohomology_groups(this,sh_00,dim_sigma);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0);
    }
    __end0_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    key = (Simplex_key)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)&key), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end0_1);
      local_90 = *puVar3;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->ds_parent_,local_90);
      local_171 = false;
      if (*pvVar4 == local_90) {
        local_98._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::find(&this->zero_cocycles_,&local_90);
        local_a0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::end(&this->zero_cocycles_);
        local_171 = std::__detail::operator==(&local_98,&local_a0);
      }
      if (local_171 != false) {
        local_a8 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::simplex(this->cpx_,local_90);
        local_b0 = cubical_complex::
                   Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                   ::null_simplex();
        __range3_2._4_4_ = Field_Zp::characteristic(&this->coeff_field_);
        std::
        vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
        ::emplace_back<unsigned_long,unsigned_long,int>
                  ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                    *)&this->persistent_pairs_,&local_a8,&local_b0,(int *)((long)&__range3_2 + 4));
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end0_1);
    }
    __end0_2 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::begin(&this->zero_cocycles_);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->zero_cocycles_);
    while (bVar1 = std::__detail::operator!=
                             (&__end0_2.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ,&local_d0), bVar1) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
               operator*(&__end0_2);
      uStack_e8 = ppVar5->first;
      zero_idx.first = ppVar5->second;
      local_f0 = cubical_complex::
                 Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                 ::simplex(this->cpx_,zero_idx.first);
      local_f8 = cubical_complex::
                 Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                 ::null_simplex();
      __range3_3._4_4_ = Field_Zp::characteristic(&this->coeff_field_);
      std::
      vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
      ::emplace_back<unsigned_long,unsigned_long,int>
                ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                  *)&this->persistent_pairs_,&local_f0,&local_f8,(int *)((long)&__range3_3 + 4));
      std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
      operator++(&__end0_2);
    }
    __end0_3 = std::
               map<unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
               ::begin(&this->transverse_idx_);
    local_118._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
         ::end(&this->transverse_idx_);
    while (bVar1 = std::operator!=(&__end0_3,&local_118), bVar1) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
               ::operator*(&__end0_3);
      cocycle.second.row_ = *(Hcell **)&(ppVar6->second).characteristics_;
      SStack_138 = ppVar6->first;
      cocycle.first = (unsigned_long)(ppVar6->second).row_;
      local_140 = cubical_complex::
                  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                  ::simplex(this->cpx_,SStack_138);
      local_148 = cubical_complex::
                  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                  ::null_simplex();
      std::
      vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
      ::emplace_back<unsigned_long,unsigned_long,int&>
                ((vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>
                  *)&this->persistent_pairs_,&local_140,&local_148,(int *)&cocycle.second);
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>
      ::operator++(&__end0_3);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range3);
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }